

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

void MatchFinder_Normalize3(UInt32 subValue,CLzRef *items,size_t numItems)

{
  size_t sVar1;
  CLzRef CVar2;
  
  if (numItems != 0) {
    sVar1 = 0;
    do {
      CVar2 = items[sVar1] - subValue;
      if (items[sVar1] < subValue) {
        CVar2 = 0;
      }
      items[sVar1] = CVar2;
      sVar1 = sVar1 + 1;
    } while (numItems != sVar1);
  }
  return;
}

Assistant:

void MatchFinder_Normalize3(UInt32 subValue, CLzRef *items, size_t numItems)
{
  size_t i;
  for (i = 0; i < numItems; i++)
  {
    UInt32 value = items[i];
    if (value <= subValue)
      value = kEmptyHashValue;
    else
      value -= subValue;
    items[i] = value;
  }
}